

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyCleanStyle(TidyDocImpl *doc,Node *html)

{
  Bool fix;
  Node *head;
  Node *node;
  
  if (html != (Node *)0x0) {
    fix = *(Bool *)((doc->config).value + 0x51);
    head = prvTidyFindHEAD(doc);
    node = prvTidyFindBody(doc);
    if (node != (Node *)0x0 && head != (Node *)0x0) {
      StyleToHead(doc,head,node,fix,0);
      return;
    }
  }
  return;
}

Assistant:

void TY_(CleanStyle)(TidyDocImpl* doc, Node *html)
{
    Node *head = NULL, *body = NULL;
    Bool fix = cfgBool(doc, TidyStyleTags);

    if (!html)
        return; /* oops, not given a start node */

    head = TY_(FindHEAD)( doc );
    body = TY_(FindBody)( doc );

    if ((head != NULL) && (body != NULL))
    {
		StyleToHead(doc, head, body, fix, 0); /* found head and body */
    }
}